

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
::MatchExpr(MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
            *this,FlatMap<Point,_double,_PointCmp> *arg,
           EqualsRange<FlatMap<Point,_double,_PointCmp>_> *matcher,StringRef *matcherString)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  
  iVar4 = (*(matcher->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).super_MatcherUntypedBase
            ._vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar4,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00292068;
  this->m_arg = arg;
  (this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.super_MatcherUntypedBase.
  _vptr_MatcherUntypedBase = (_func_int **)&PTR__MatcherUntypedBase_0028df40;
  (this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.super_MatcherUntypedBase.
  m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.
                 super_MatcherUntypedBase.m_cachedToString.field_2;
  pcVar1 = (matcher->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).super_MatcherUntypedBase.
           m_cachedToString._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.
              super_MatcherUntypedBase.m_cachedToString,pcVar1,
             pcVar1 + (matcher->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).
                      super_MatcherUntypedBase.m_cachedToString._M_string_length);
  (this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.super_MatcherUntypedBase.
  _vptr_MatcherUntypedBase = (_func_int **)&PTR__EqualsRange_002920a8;
  (this->m_matcher).super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>.
  super_MatcherMethod<FlatMap<Point,_double,_PointCmp>_>._vptr_MatcherMethod =
       (_func_int **)&DAT_002920d8;
  (this->m_matcher).expected_._M_dataplus._M_p = (pointer)&(this->m_matcher).expected_.field_2;
  pcVar2 = (matcher->expected_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).expected_,pcVar2,
             pcVar2 + (matcher->expected_)._M_string_length);
  sVar3 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar3;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}